

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::Integrator::getSolution
          (Integrator *this,double time,VectorDynSize *solution)

{
  pointer pSVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar7;
  pointer pcVar8;
  ostringstream errorMsg;
  pointer local_1b0 [2];
  undefined1 local_1a0 [16];
  pointer local_190 [14];
  ios_base local_120 [264];
  pointer pSVar6;
  
  pSVar1 = (this->m_solution).
           super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (this->m_solution).
           super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 == pSVar1) {
    pcVar8 = (((this->m_info).m_data.
               super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name)._M_dataplus._M_p;
    pcVar7 = "No solution computed yet.";
LAB_00141e16:
    iDynTree::reportError(pcVar8,"getSolution",pcVar7);
  }
  else {
    if ((pSVar1->time <= time) &&
       (local_190[0] = pSVar1, time < pSVar6[-1].time || time == pSVar6[-1].time)) {
      do {
        pSVar1 = local_190[0] + 1;
        bVar2 = pSVar1 != pSVar6;
        if (!bVar2) goto LAB_00141e8a;
        local_190[0] = pSVar1;
      } while ((time < pSVar1[-1].time) || (pSVar1->time < time));
      local_190[0] = pSVar1 + -1;
      local_1b0[0] = pSVar1;
      uVar4 = (*this->_vptr_Integrator[0xe])(this,local_190,local_1b0,solution);
      pSVar6 = (pointer)(ulong)uVar4;
LAB_00141e8a:
      bVar3 = (byte)pSVar6;
      if (bVar2) goto LAB_00141e1d;
      pcVar8 = (((this->m_info).m_data.
                 super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->name)._M_dataplus._M_p;
      pcVar7 = "Error while searching the desired time.";
      goto LAB_00141e16;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Time outside the computed range. ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Valid range: [",0xe);
    poVar5 = std::ostream::_M_insert<double>
                       (((this->m_solution).
                         super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                         ._M_impl.super__Vector_impl_data._M_start)->time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    poVar5 = std::ostream::_M_insert<double>
                       ((this->m_solution).
                        super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]. ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Requested value: ",0x11);
    poVar5 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    pcVar7 = (((this->m_info).m_data.
               super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name)._M_dataplus._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar7,"getSolution",(char *)local_1b0[0]);
    if (local_1b0[0] != (pointer)local_1a0) {
      operator_delete(local_1b0[0],local_1a0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  bVar3 = 0;
LAB_00141e1d:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Integrator::getSolution(double time, VectorDynSize &solution) const{
                if (m_solution.size() == 0){
                    reportError(m_info.name().c_str(), "getSolution", "No solution computed yet.");
                    return false;
                }

                if((time < m_solution.front().time)||(time > m_solution.back().time)){
                    std::ostringstream errorMsg;
                    errorMsg << "Time outside the computed range. ";
                    errorMsg << "Valid range: [" << m_solution.front().time << ", " << m_solution.back().time << "]. ";
                    errorMsg << "Requested value: " << time << ".";
                    reportError(m_info.name().c_str(), "getSolution", errorMsg.str().c_str());
                    return false;
                }

                for (std::vector<SolutionElement>::const_iterator iteration = m_solution.cbegin();
                     (iteration +1) != m_solution.cend(); ++iteration){

                    if ((iteration->time <= time) && ((iteration + 1)->time >= time)){
                        return interpolatePoints(iteration, iteration+1, time, solution);
                    }
                }

                reportError(m_info.name().c_str(), "getSolution", "Error while searching the desired time.");
                return false;
            }